

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::VirtualityString(uint Virtuality)

{
  undefined1 auStack_18 [4];
  uint Virtuality_local;
  
  if (Virtuality == 0) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_VIRTUALITY_none");
  }
  else if (Virtuality == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_VIRTUALITY_virtual");
  }
  else if (Virtuality == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_VIRTUALITY_pure_virtual");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::VirtualityString(unsigned Virtuality) {
  switch (Virtuality) {
  default:
    return StringRef();
#define HANDLE_DW_VIRTUALITY(ID, NAME)                                         \
  case DW_VIRTUALITY_##NAME:                                                   \
    return "DW_VIRTUALITY_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}